

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

dir_tree_t * add_dirs(char **argv)

{
  FILE *__stream;
  long lVar1;
  int *piVar2;
  char *pcVar3;
  long lVar4;
  size_t sVar5;
  file_entry_t *pfVar6;
  file_entry_t *file;
  dir_tree_t *trees;
  dir_tree_t *tree;
  FTSENT *ent;
  FTS *fts;
  char **argv_local;
  
  file = (file_entry_t *)0x0;
  lVar1 = fts_open(argv,2,0);
  __stream = _stderr;
  if (lVar1 == 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(__stream,"Failed to start directory traversal: %s\n",pcVar3);
    argv_local = (char **)0x0;
  }
  else {
    while (lVar4 = fts_read(lVar1), lVar4 != 0) {
      if ((*(short *)(lVar4 + 0x62) == 1) && (*(char *)(lVar4 + 0x70) == '.')) {
        fts_set(lVar1,lVar4,4);
      }
      if ((*(short *)(lVar4 + 0x62) == 1) && (*(short *)(lVar4 + 0x60) == 0)) {
        trees = alloc_dir_tree(*(char **)(lVar4 + 0x30));
        if ((file_entry_t *)trees == (file_entry_t *)0x0) {
          no_mem = 1;
          break;
        }
        ((file_entry_t *)trees)->next = file;
        file = (file_entry_t *)trees;
      }
      if ((*(short *)(lVar4 + 0x62) == 8) &&
         (sVar5 = strlen((char *)(lVar4 + 0x70)), *(char *)(lVar4 + sVar5 + 0x6f) != '~')) {
        pfVar6 = alloc_file_entry("",*(char **)(lVar4 + 0x30),
                                  *(time_t *)(*(long *)(lVar4 + 0x68) + 0x58));
        if (pfVar6 == (file_entry_t *)0x0) {
          no_mem = 1;
          break;
        }
        pfVar6->next = trees->files;
        trees->files = pfVar6;
      }
    }
    fts_close(lVar1);
    argv_local = (char **)file;
  }
  return (dir_tree_t *)argv_local;
}

Assistant:

dir_tree_t *add_dirs(char **argv)
{
	FTS *fts;
	FTSENT *ent;
	dir_tree_t *tree, *trees = NULL;
	file_entry_t *file;

	fts = fts_open(argv, FTS_LOGICAL, NULL);
	if (fts == NULL)
	{
		fprintf(stderr, "Failed to start directory traversal: %s\n", strerror(errno));
		return NULL;
	}
	while ((ent = fts_read(fts)) != NULL)
	{
		if (ent->fts_info == FTS_D && ent->fts_name[0] == '.')
		{
			// Skip hidden directories. (Prevents SVN bookkeeping
			// info from being included.)
			// [BL] Also skip backup files.
			fts_set(fts, ent, FTS_SKIP);
		}
		if (ent->fts_info == FTS_D && ent->fts_level == 0)
		{
			tree = alloc_dir_tree(ent->fts_path);
			if (tree == NULL)
			{
				no_mem = 1;
				break;
			}
			tree->next = trees;
			trees = tree;
		}
		if (ent->fts_info != FTS_F)
		{
			// We're only interested in remembering files.
			continue;
		}
		else if(ent->fts_name[strlen(ent->fts_name)-1] == '~')
		{
			// Don't remember backup files.
			continue;
		}
		file = alloc_file_entry("", ent->fts_path, ent->fts_statp->st_mtime);
		if (file == NULL)
		{
			no_mem = 1;
			break;
		}
		file->next = tree->files;
		tree->files = file;
	}
	fts_close(fts);
	return trees;
}